

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZGeoNodeBC_*> * __thiscall
TPZVec<TPZGeoNodeBC_*>::operator=(TPZVec<TPZGeoNodeBC_*> *this,TPZVec<TPZGeoNodeBC_*> *rval)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  TPZGeoNodeBC **ppTVar3;
  TPZVec<TPZGeoNodeBC_*> *in_RSI;
  TPZVec<TPZGeoNodeBC_*> *in_RDI;
  int64_t i;
  long local_18;
  
  if (in_RDI != in_RSI) {
    in_RDI->fNElements = in_RSI->fNElements;
    if ((in_RDI->fStore != (TPZGeoNodeBC **)0x0) && (in_RDI->fStore != (TPZGeoNodeBC **)0x0)) {
      operator_delete__(in_RDI->fStore);
    }
    if (in_RSI->fNAlloc == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDI->fNElements;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      ppTVar3 = (TPZGeoNodeBC **)operator_new__(uVar2);
      in_RDI->fStore = ppTVar3;
      for (local_18 = 0; local_18 < in_RDI->fNElements; local_18 = local_18 + 1) {
        in_RDI->fStore[local_18] = in_RSI->fStore[local_18];
      }
    }
    else {
      in_RDI->fStore = in_RSI->fStore;
    }
    in_RDI->fNAlloc = in_RDI->fNElements;
    in_RSI->fStore = (TPZGeoNodeBC **)0x0;
    in_RSI->fNElements = 0;
    in_RSI->fNAlloc = 0;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}